

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool Am_Replace_Placeholders
               (Am_Object *cmd,Am_Slot_Key slot,bool *did_a_replace,Am_Value *orig_value,
               Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  unsigned_short uVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  Am_Wrapper *in_value;
  Am_Value_List new_list;
  Am_Object ph;
  bool local_b4;
  Am_Value_List orig_list;
  Am_Value ret_val;
  Am_Value val;
  Am_Object local_78;
  Am_Value *local_70;
  Am_Object *local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Placeholder_Replace_Method replace_method;
  
  pAVar5 = Am_Object::Get(cmd,slot,1);
  Am_Value::operator=(orig_value,pAVar5);
  if (am_sdebug == true) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Checking placeholders for cmd ");
    poVar6 = operator<<(poVar6,cmd);
    poVar6 = std::operator<<(poVar6," slot ");
    val.type = slot;
    poVar6 = operator<<(poVar6,(Am_Am_Slot_Key *)&val);
    poVar6 = std::operator<<(poVar6," orig value ");
    poVar6 = operator<<(poVar6,orig_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
  }
  val.type = 0;
  val.value.wrapper_value = (Am_Wrapper *)0x0;
  ret_val.type = 0;
  ret_val.value.wrapper_value = (Am_Wrapper *)0x0;
  *did_a_replace = false;
  ph.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value::Valid(orig_value);
  local_b4 = true;
  if (!bVar1) goto LAB_001f87d9;
  bVar1 = Am_Value_List::Test(orig_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&orig_list,orig_value);
    local_70 = new_value;
    local_68 = sel_widget;
    Am_Value_List::Start(&orig_list);
    while( true ) {
      bVar1 = Am_Value_List::Last(&orig_list);
      if (bVar1) break;
      pAVar5 = Am_Value_List::Get(&orig_list);
      Am_Value::operator=(&val,pAVar5);
      if (val.type == 0xa001) {
        Am_Object::Am_Object((Am_Object *)&new_list,&val);
        Am_Object::Am_Object(&local_58,&Am_A_Placeholder);
        bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&new_list,&local_58);
        Am_Object::~Am_Object(&local_58);
        Am_Object::~Am_Object((Am_Object *)&new_list);
        if (bVar1) {
          Am_Value_List::Am_Value_List(&new_list);
          Am_Value_List::Start(&orig_list);
          goto LAB_001f861a;
        }
      }
      Am_Value_List::Next(&orig_list);
    }
    Am_Value_List::~Am_Value_List(&orig_list);
    goto LAB_001f87d9;
  }
  if (orig_value->type != 0xa001) goto LAB_001f87d9;
  Am_Object::Am_Object((Am_Object *)&orig_list,orig_value);
  Am_Object::Am_Object(&local_78,&Am_A_Placeholder);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&orig_list,&local_78);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object((Am_Object *)&orig_list);
  if (!bVar1) goto LAB_001f87d9;
  Am_Object::operator=(&ph,orig_value);
  pAVar5 = Am_Object::Get(&ph,Am_PLACEHOLDER_REPLACE_METHOD,0);
  Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method
            ((Am_Placeholder_Replace_Method *)&orig_list,pAVar5);
  cVar2 = (*(code *)orig_list.item)(&ph,new_value,sel_widget);
  bVar1 = Am_Value_List::Test(new_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&new_list,new_value);
    uVar4 = Am_Value_List::Length(&new_list);
    Am_Value_List::~Am_Value_List(&new_list);
    if (uVar4 == 1) {
      Am_Value_List::Am_Value_List(&new_list,new_value);
      Am_Value_List::Start(&new_list);
      pAVar5 = Am_Value_List::Get(&new_list);
      Am_Value::operator=(new_value,pAVar5);
      Am_Value_List::~Am_Value_List(&new_list);
    }
  }
  if (cVar2 != '\0') {
    *did_a_replace = true;
    if (am_sdebug == true) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Found one placeholder and replaced with ");
      poVar6 = operator<<(poVar6,new_value);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::ostream::flush();
    }
    goto LAB_001f87d9;
  }
  goto LAB_001f87d1;
LAB_001f861a:
  bVar1 = Am_Value_List::Last(&orig_list);
  if (bVar1) goto LAB_001f875d;
  pAVar5 = Am_Value_List::Get(&orig_list);
  Am_Value::operator=(&val,pAVar5);
  if (val.type == 0xa001) {
    Am_Object::Am_Object((Am_Object *)&replace_method,&val);
    Am_Object::Am_Object(&local_60,&Am_A_Placeholder);
    bVar3 = Am_Object::Is_Instance_Of((Am_Object *)&replace_method,&local_60);
    Am_Object::~Am_Object(&local_60);
    Am_Object::~Am_Object((Am_Object *)&replace_method);
    if (!bVar3) goto LAB_001f8728;
    Am_Object::operator=(&ph,&val);
    pAVar5 = Am_Object::Get(&ph,Am_PLACEHOLDER_REPLACE_METHOD,0);
    Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method(&replace_method,pAVar5);
    bVar3 = (*replace_method.Call)(&ph,&ret_val,local_68);
    if (!bVar3) goto LAB_001f87b8;
    bVar1 = Am_Value::Valid(&ret_val);
    if (bVar1) {
      bVar1 = Am_Value_List::Test(&ret_val);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_50,&ret_val);
        Am_Value_List::Append(&new_list,&local_50,true);
        Am_Value_List::~Am_Value_List(&local_50);
      }
      else {
        Am_Value_List::Add(&new_list,&ret_val,Am_TAIL,true);
      }
    }
  }
  else {
LAB_001f8728:
    Am_Value_List::Add(&new_list,&val,Am_TAIL,true);
  }
  Am_Value_List::Next(&orig_list);
  goto LAB_001f861a;
LAB_001f875d:
  *did_a_replace = true;
  in_value = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_list);
  Am_Value::operator=(local_70,in_value);
  if (am_sdebug == true) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Found placeholders in list and replaced with ");
    poVar6 = operator<<(poVar6,local_70);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
  }
LAB_001f87b8:
  Am_Value_List::~Am_Value_List(&new_list);
  Am_Value_List::~Am_Value_List(&orig_list);
  if (bVar1) goto LAB_001f87d9;
LAB_001f87d1:
  local_b4 = false;
LAB_001f87d9:
  Am_Object::~Am_Object(&ph);
  Am_Value::~Am_Value(&ret_val);
  Am_Value::~Am_Value(&val);
  return local_b4;
}

Assistant:

bool
Am_Replace_Placeholders(Am_Object &cmd, Am_Slot_Key slot, bool &did_a_replace,
                        Am_Value &orig_value, Am_Value &new_value,
                        Am_Object &sel_widget)
{
  orig_value = cmd.Peek(slot);
  if (am_sdebug)
    std::cout << "Checking placeholders for cmd " << cmd << " slot "
              << Am_Am_Slot_Key(slot) << " orig value " << orig_value
              << std::endl
              << std::flush;
  Am_Value val, ret_val;
  bool ok;
  did_a_replace = false;
  Am_Object ph;
  if (!orig_value.Valid())
    return true; //nothing to do, and is OK
  else if (Am_Value_List::Test(orig_value)) {
    Am_Value_List orig_list = orig_value;
    //first, search to see if any placeholders
    bool found_one = false;
    for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
      val = orig_list.Get();
      if (val.type == Am_OBJECT &&
          Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
        found_one = true;
        break;
      }
    }
    if (!found_one)
      return true;
    else {
      Am_Value_List new_list;
      for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
        val = orig_list.Get();
        if (val.type == Am_OBJECT &&
            Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
          ph = val;
          Am_Placeholder_Replace_Method replace_method =
              ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
          ok = replace_method.Call(ph, ret_val, sel_widget);
          if (!ok)
            return false;
          if (ret_val.Valid()) { //otherwise, leave new_list without ret_val
            if (Am_Value_List::Test(ret_val))
              new_list.Append(ret_val);
            else
              new_list.Add(ret_val);
          }
        } else
          new_list.Add(val);
      }
      did_a_replace = true;
      new_value = new_list;
      if (am_sdebug)
        std::cout << "Found placeholders in list and replaced with "
                  << new_value << std::endl
                  << std::flush;
    }
  } else { //not a list
    if (orig_value.type == Am_OBJECT &&
        Am_Object(orig_value).Is_Instance_Of(Am_A_Placeholder)) {
      ph = orig_value;
      Am_Placeholder_Replace_Method replace_method =
          ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
      ok = replace_method.Call(ph, new_value, sel_widget);
      if (Am_Value_List::Test(new_value) &&
          Am_Value_List(new_value).Length() == 1) {
        Am_Value_List l = new_value;
        l.Start();
        new_value = l.Get();
      }
      if (!ok)
        return false;
      did_a_replace = true;
      if (am_sdebug)
        std::cout << "Found one placeholder and replaced with " << new_value
                  << std::endl
                  << std::flush;
    }
  }
  return true;
}